

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
pbrt::Image::CopyRectOut(Image *this,Bounds2i *extent,span<float> buf,WrapMode2D wrapMode)

{
  int iVar1;
  int iVar2;
  PixelFormat PVar3;
  float *pfVar4;
  Image *pIVar5;
  bool bVar6;
  Point2<int> *args_5;
  Point2<int> *pPVar7;
  WrapMode WVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  int iVar10;
  Bounds2<int> *b;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *args;
  int iVar15;
  char *args_1;
  size_t *args_3;
  size_t *psVar16;
  int x_4;
  int x_3;
  uint uVar17;
  int x_1;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int x;
  uint uVar21;
  size_t sVar22;
  long lVar23;
  span<const_unsigned_char> vin;
  span<float> vout;
  int vb;
  WrapMode WStack_94;
  Point2<int> local_90;
  uint local_84;
  Bounds2<int> *local_80;
  Image *local_78;
  size_t va;
  Image *local_68;
  array<pbrt::WrapMode,_2> local_60;
  float *local_58;
  int vb_1;
  int iStack_4c;
  Tuple2<pbrt::Point2,_int> local_48;
  uint local_3c;
  Tuple2<pbrt::Point2,_int> *local_38;
  
  TVar9 = (Tuple2<pbrt::Point2,_int>)buf.n;
  local_58 = buf.ptr;
  args_3 = (size_t *)&vb;
  psVar16 = (size_t *)&vb;
  args_5 = (Point2<int> *)&vb;
  pPVar7 = (Point2<int> *)&vb;
  local_68 = (Image *)va;
  va._0_4_ = TVar9.x;
  va._4_4_ = TVar9.y;
  iVar1 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.x;
  iVar11 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  iVar10 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  iVar2 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
  uVar21 = (uint)(this->channelNames).nStored;
  uVar17 = iVar1 - iVar11;
  iVar15 = (iVar2 - iVar10) * uVar17 * uVar21;
  local_80 = extent;
  local_60 = wrapMode.wrap.values;
  vb = iVar15;
  if ((ulong)TVar9 < (ulong)(long)iVar15) {
    LogFatal<char_const(&)[11],char_const(&)[28],char_const(&)[11],unsigned_long&,char_const(&)[28],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x293,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [11])"buf.size()",
               (char (*) [28])"extent.Area() * NChannels()",(char (*) [11])"buf.size()",&va,
               (char (*) [28])"extent.Area() * NChannels()",&vb);
  }
  PVar3 = this->format;
  uVar19 = (int)uVar21 >> 0x1f;
  uVar12 = (int)uVar17 >> 0x1f;
  local_78 = this;
  if (PVar3 == Float) {
    va._0_4_ = iVar11;
    if (iVar1 <= iVar11) {
      args_3 = &va;
LAB_004696ef:
      vb = iVar1;
      args_1 = "extent.pMax.x";
      args = "extent.pMin.x";
      iVar10 = 0x60;
      goto LAB_00469797;
    }
    va._0_4_ = iVar10;
    vb = iVar2;
    if (iVar10 < iVar2) {
      TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar18 = TVar9.x;
      uVar20 = TVar9.y;
      WStack_94 = (int)uVar20 >> 0x1f & uVar20;
      vb = (int)uVar18 >> 0x1f & uVar18;
      uVar13 = 0;
      if (0 < (int)uVar18) {
        uVar13 = (ulong)TVar9 & 0xffffffff;
      }
      uVar14 = 0;
      if (uVar20 != 0 && -1 < (long)TVar9) {
        uVar14 = (ulong)TVar9 >> 0x20;
      }
      local_90.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)(uVar13 | uVar14 << 0x20);
      _va = (anon_class_16_2_22da72ca)Intersect<int>(extent,(Bounds2<int> *)&vb);
      bVar6 = Bounds2<int>::operator==((Bounds2<int> *)&va,extent);
      pIVar5 = local_78;
      iVar11 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y;
      if (bVar6) {
        iVar10 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x;
        iVar2 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y;
        iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        sVar22 = (this->channelNames).nStored;
        for (; iVar11 < iVar2; iVar11 = iVar11 + 1) {
          iVar15 = (iVar11 * iVar1 + iVar10) * (int)sVar22;
          for (uVar18 = 0; uVar18 != (~uVar12 & uVar17); uVar18 = uVar18 + 1) {
            pfVar4 = (local_78->p32).ptr;
            for (lVar23 = 0; (~uVar19 & uVar21) != (uint)lVar23; lVar23 = lVar23 + 1) {
              *local_58 = pfVar4[iVar15 + lVar23];
              local_58 = local_58 + 1;
            }
            iVar15 = iVar15 + (uint)lVar23;
          }
        }
        return;
      }
      do {
        if ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y <= iVar11) {
          return;
        }
        for (uVar18 = 0; uVar18 != (~uVar12 & uVar17); uVar18 = uVar18 + 1) {
          va = CONCAT44(iVar11,(extent->pMin).super_Tuple2<pbrt::Point2,_int>.x + uVar18);
          bVar6 = RemapPixelCoords((Point2i *)&va,
                                   (Point2i)(pIVar5->resolution).super_Tuple2<pbrt::Point2,_int>,
                                   (WrapMode2D)local_60.values);
          if (!bVar6) goto LAB_0046965c;
          iVar10 = (pIVar5->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          sVar22 = (pIVar5->channelNames).nStored;
          pfVar4 = (pIVar5->p32).ptr;
          for (lVar23 = 0; (~uVar19 & uVar21) != (uint)lVar23; lVar23 = lVar23 + 1) {
            *local_58 = pfVar4[(va._4_4_ * iVar10 + (int)va) * (int)sVar22 + lVar23];
            local_58 = local_58 + 1;
          }
          extent = local_80;
        }
        iVar11 = iVar11 + 1;
      } while( true );
    }
    psVar16 = &va;
  }
  else {
    if (PVar3 != Half) {
      if (PVar3 != U256) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                 ,0x2c2,"Unhandled PixelFormat");
      }
      vb_1 = 0;
      iStack_4c = 0;
      local_38 = &(this->resolution).super_Tuple2<pbrt::Point2,_int>;
      Bounds2<int>::Bounds2((Bounds2<int> *)&vb,(Point2<int> *)&vb_1,(Point2<int> *)local_38);
      b = local_80;
      _va = (anon_class_16_2_22da72ca)Intersect<int>(local_80,(Bounds2<int> *)&vb);
      bVar6 = Bounds2<int>::operator==((Bounds2<int> *)&va,b);
      if (bVar6) {
        sVar22 = (size_t)(((b->pMax).super_Tuple2<pbrt::Point2,_int>.x -
                          (b->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                         (int)(this->channelNames).nStored);
        iVar11 = (b->pMin).super_Tuple2<pbrt::Point2,_int>.y;
        for (; iVar11 < (b->pMax).super_Tuple2<pbrt::Point2,_int>.y; iVar11 = iVar11 + 1) {
          vin.ptr = (local_78->p8).ptr +
                    ((local_78->resolution).super_Tuple2<pbrt::Point2,_int>.x * iVar11 +
                    (b->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                    (int)(local_78->channelNames).nStored;
          vin.n = sVar22;
          vout.n = sVar22;
          vout.ptr = local_58;
          ColorEncodingHandle::ToLinear(&this->encoding,vin,vout);
          local_58 = local_58 + sVar22;
          b = local_80;
        }
        return;
      }
      local_68 = this;
      va = (size_t)&local_58;
      vb = (b->pMin).super_Tuple2<pbrt::Point2,_int>.x;
      iVar11 = (b->pMax).super_Tuple2<pbrt::Point2,_int>.x;
      uVar21 = iVar11 - vb;
      if (uVar21 == 0 || iVar11 < vb) {
        args_1 = "extent.pMax.x";
        args = "extent.pMin.x";
        iVar10 = 0x60;
      }
      else {
        vb = (b->pMin).super_Tuple2<pbrt::Point2,_int>.y;
        iVar11 = (b->pMax).super_Tuple2<pbrt::Point2,_int>.y;
        if (vb < iVar11) {
          uVar13 = 0;
          uVar17 = (uint)(local_78->channelNames).nStored;
          TVar9 = (local_78->resolution).super_Tuple2<pbrt::Point2,_int>;
          uVar19 = TVar9.x;
          uVar12 = TVar9.y;
          vb_1 = (int)uVar19 >> 0x1f & uVar19;
          iStack_4c = (int)uVar12 >> 0x1f & uVar12;
          uVar14 = 0;
          if (0 < (int)uVar19) {
            uVar14 = (ulong)TVar9 & 0xffffffff;
          }
          if (uVar12 != 0 && -1 < (long)TVar9) {
            uVar13 = (ulong)uVar12;
          }
          local_48 = (Tuple2<pbrt::Point2,_int>)(uVar14 | uVar13 << 0x20);
          _vb = Intersect<int>(b,(Bounds2<int> *)&vb_1);
          bVar6 = Bounds2<int>::operator==((Bounds2<int> *)&vb,b);
          WVar8 = (b->pMin).super_Tuple2<pbrt::Point2,_int>.y;
          if (bVar6) {
            local_84 = ~((int)uVar17 >> 0x1f) & uVar17;
            while (uVar17 = local_84, (int)WVar8 < (b->pMax).super_Tuple2<pbrt::Point2,_int>.y) {
              local_60.values[0] = WVar8;
              iVar11 = ((local_78->resolution).super_Tuple2<pbrt::Point2,_int>.x * WVar8 +
                       (b->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                       (int)(local_78->channelNames).nStored;
              for (uVar19 = 0; uVar12 = uVar17, uVar19 != (~((int)uVar21 >> 0x1f) & uVar21);
                  uVar19 = uVar19 + 1) {
                while (bVar6 = uVar12 != 0, uVar12 = uVar12 - 1, bVar6) {
                  CopyRectOut::anon_class_16_2_22da72ca::operator()
                            ((anon_class_16_2_22da72ca *)&va,iVar11);
                  iVar11 = iVar11 + 1;
                }
              }
              b = local_80;
              WVar8 = local_60.values[0] + Black;
            }
            return;
          }
          local_3c = ~((int)uVar17 >> 0x1f) & uVar17;
          local_84 = ~((int)uVar21 >> 0x1f) & uVar21;
          do {
            if ((b->pMax).super_Tuple2<pbrt::Point2,_int>.y <= (int)WVar8) {
              return;
            }
            for (uVar21 = 0; uVar21 != local_84; uVar21 = uVar21 + 1) {
              WStack_94 = WVar8;
              vb = (b->pMin).super_Tuple2<pbrt::Point2,_int>.x + uVar21;
              bVar6 = RemapPixelCoords((Point2i *)&vb,(Point2i)*local_38,(WrapMode2D)local_60.values
                                      );
              if (!bVar6) goto LAB_0046965c;
              uVar17 = local_3c;
              iVar11 = (vb._4_4_ * (local_78->resolution).super_Tuple2<pbrt::Point2,_int>.x + vb) *
                       (int)(local_78->channelNames).nStored;
              while (bVar6 = uVar17 != 0, uVar17 = uVar17 - 1, bVar6) {
                CopyRectOut::anon_class_16_2_22da72ca::operator()
                          ((anon_class_16_2_22da72ca *)&va,iVar11);
                iVar11 = iVar11 + 1;
              }
              b = local_80;
            }
            WVar8 = WVar8 + Black;
          } while( true );
        }
        args_1 = "extent.pMax.y";
        args = "extent.pMin.y";
        iVar10 = 0x61;
      }
      vb_1 = iVar11;
      args_3 = (size_t *)&vb;
      args_5 = (Point2<int> *)&vb_1;
      goto LAB_00469797;
    }
    vb_1 = iVar1;
    local_68 = this;
    va = (size_t)&local_58;
    if (iVar1 <= iVar11) {
      args_5 = (Point2<int> *)&vb_1;
      iVar1 = iVar11;
      goto LAB_004696ef;
    }
    vb = iVar10;
    vb_1 = iVar2;
    if (iVar10 < iVar2) {
      TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar18 = TVar9.x;
      uVar20 = TVar9.y;
      vb_1 = (int)uVar18 >> 0x1f & uVar18;
      iStack_4c = (int)uVar20 >> 0x1f & uVar20;
      uVar13 = 0;
      if (0 < (int)uVar18) {
        uVar13 = (ulong)TVar9 & 0xffffffff;
      }
      uVar14 = 0;
      if (uVar20 != 0 && -1 < (long)TVar9) {
        uVar14 = (ulong)TVar9 >> 0x20;
      }
      local_48 = (Tuple2<pbrt::Point2,_int>)(uVar13 | uVar14 << 0x20);
      _vb = Intersect<int>(extent,(Bounds2<int> *)&vb_1);
      bVar6 = Bounds2<int>::operator==((Bounds2<int> *)&vb,extent);
      WVar8 = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y;
      if (bVar6) {
        while ((int)WVar8 < (extent->pMax).super_Tuple2<pbrt::Point2,_int>.y) {
          local_60.values[0] = WVar8;
          iVar11 = ((local_78->resolution).super_Tuple2<pbrt::Point2,_int>.x * WVar8 +
                   (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x) *
                   (int)(local_78->channelNames).nStored;
          for (uVar18 = 0; uVar20 = ~uVar19 & uVar21, uVar18 != (~uVar12 & uVar17);
              uVar18 = uVar18 + 1) {
            while (bVar6 = uVar20 != 0, uVar20 = uVar20 - 1, bVar6) {
              CopyRectOut::anon_class_16_2_22da72ca::operator()
                        ((anon_class_16_2_22da72ca *)&va,iVar11);
              iVar11 = iVar11 + 1;
            }
          }
          extent = local_80;
          WVar8 = local_60.values[0] + Black;
        }
        return;
      }
      local_84 = ~uVar19 & uVar21;
      do {
        if ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y <= (int)WVar8) {
          return;
        }
        for (uVar21 = 0; pIVar5 = local_78, uVar21 != (~uVar12 & uVar17); uVar21 = uVar21 + 1) {
          WStack_94 = WVar8;
          vb = (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x + uVar21;
          bVar6 = RemapPixelCoords((Point2i *)&vb,
                                   (Point2i)(local_78->resolution).super_Tuple2<pbrt::Point2,_int>,
                                   (WrapMode2D)local_60.values);
          if (!bVar6) {
LAB_0046965c:
            LogFatal<char_const(&)[51]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                       ,0x72,"Check failed: %s",
                       (char (*) [51])"RemapPixelCoords(&p, image.Resolution(), wrapMode)");
          }
          uVar19 = local_84;
          iVar11 = (vb._4_4_ * (pIVar5->resolution).super_Tuple2<pbrt::Point2,_int>.x + vb) *
                   (int)(pIVar5->channelNames).nStored;
          while (bVar6 = uVar19 != 0, uVar19 = uVar19 - 1, bVar6) {
            CopyRectOut::anon_class_16_2_22da72ca::operator()
                      ((anon_class_16_2_22da72ca *)&va,iVar11);
            iVar11 = iVar11 + 1;
          }
          extent = local_80;
        }
        WVar8 = WVar8 + Black;
      } while( true );
    }
    pPVar7 = (Point2<int> *)&vb_1;
  }
  args_1 = "extent.pMax.y";
  args = "extent.pMin.y";
  iVar10 = 0x61;
  args_3 = psVar16;
  args_5 = pPVar7;
LAB_00469797:
  LogFatal<char_const(&)[14],char_const(&)[14],char_const(&)[14],int&,char_const(&)[14],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,iVar10,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [14])args,
             (char (*) [14])args_1,(char (*) [14])args,(int *)args_3,(char (*) [14])args_1,
             (int *)args_5);
}

Assistant:

void Image::CopyRectOut(const Bounds2i &extent, pstd::span<float> buf,
                        WrapMode2D wrapMode) {
    CHECK_GE(buf.size(), extent.Area() * NChannels());

    auto bufIter = buf.begin();
    switch (format) {
    case PixelFormat::U256:
        if (Intersect(extent, Bounds2i({0, 0}, resolution)) == extent) {
            // All in bounds
            size_t count = NChannels() * (extent.pMax.x - extent.pMin.x);
            for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
                // Convert scanlines all at once.
                size_t offset = PixelOffset({extent.pMin.x, y});
#ifdef PBRT_FLOAT_AS_DOUBLE
                for (int i = 0; i < count; ++i) {
                    Float v;
                    encoding.ToLinear({&p8[offset + i], 1}, {&v, 1});
                    *bufIter++ = v;
                }
#else
                encoding.ToLinear({&p8[offset], count}, {&*bufIter, count});
#endif
                bufIter += count;
            }
        } else {
            ForExtent(extent, wrapMode, *this, [&bufIter, this](int offset) {
#ifdef PBRT_FLOAT_AS_DOUBLE
                Float v;
                encoding.ToLinear({&p8[offset], 1}, {&v, 1});
                *bufIter = v;
#else
                encoding.ToLinear({&p8[offset], 1}, {&*bufIter, 1});
#endif
                ++bufIter;
            });
        }
        break;

    case PixelFormat::Half:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p16[offset]); });
        break;

    case PixelFormat::Float:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p32[offset]); });
        break;

    default:
        LOG_FATAL("Unhandled PixelFormat");
    }
}